

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv_layer_t.h
# Opt level: O3

void __thiscall
conv_layer_t::conv_layer_t
          (conv_layer_t *this,uint16_t stride,uint16_t extend_filter,uint16_t number_filters,
          tdsize in_size)

{
  uint _x;
  int iVar1;
  int iVar2;
  float *pfVar3;
  int _x_00;
  int _z;
  uint _x_01;
  uint _z_00;
  int j;
  int _x_02;
  uint uVar4;
  uint _y;
  tensor_t<float> t;
  tensor_t<float> local_a8;
  tensor_t<float> local_80;
  tensor_t<float> local_58;
  
  _z = in_size.z;
  _x_02 = in_size.x;
  iVar2 = in_size.y;
  tensor_t<float>::tensor_t(&local_a8,_x_02,iVar2,_z);
  tensor_t<float>::tensor_t(&local_58,_x_02,iVar2,_z);
  _x = (uint)extend_filter;
  _x_00 = (int)(_x_02 - _x) / (int)(uint)stride + 1;
  iVar1 = (int)(iVar2 - _x) / (int)(uint)stride + 1;
  _z_00 = (uint)number_filters;
  tensor_t<float>::tensor_t(&local_80,_x_00,iVar1,_z_00);
  layer_t::layer_t(&this->super_layer_t,conv,&local_a8,&local_58,&local_80);
  if (local_80.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  (this->filters).super__Vector_base<tensor_t<float>,_std::allocator<tensor_t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter_grads).
  super__Vector_base<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter_grads).
  super__Vector_base<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter_grads).
  super__Vector_base<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filters).super__Vector_base<tensor_t<float>,_std::allocator<tensor_t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filters).super__Vector_base<tensor_t<float>,_std::allocator<tensor_t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filters).super__Vector_base<tensor_t<float>,_std::allocator<tensor_t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter_grads).
  super__Vector_base<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->stride = stride;
  this->extend_filter = extend_filter;
  if ((float)(int)(_x_02 - _x) / (float)stride + 1.0 == (float)_x_00) {
    if ((float)(int)(iVar2 - _x) / (float)stride + 1.0 == (float)iVar1) {
      if (number_filters != 0) {
        uVar4 = 0;
        do {
          tensor_t<float>::tensor_t(&local_a8,_x,_x,_z);
          if (extend_filter != 0) {
            _x_01 = 0;
            do {
              _y = 0;
              do {
                if (0 < _z) {
                  iVar1 = 0;
                  do {
                    iVar2 = rand();
                    pfVar3 = tensor_t<float>::get(&local_a8,_x_01,_y,iVar1);
                    *pfVar3 = (float)iVar2 * 4.656613e-10 * (1.0 / (float)(int)(_x * _z * _x));
                    iVar1 = iVar1 + 1;
                  } while (_z != iVar1);
                }
                _y = _y + 1;
              } while (_y != _x);
              _x_01 = _x_01 + 1;
            } while (_x_01 != _x);
          }
          std::vector<tensor_t<float>,_std::allocator<tensor_t<float>_>_>::push_back
                    (&this->filters,&local_a8);
          if (local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != _z_00);
        if (number_filters != 0) {
          do {
            tensor_t<gradient_t>::tensor_t((tensor_t<gradient_t> *)&local_a8,_x,_x,_z);
            std::vector<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>::push_back
                      (&this->filter_grads,(value_type *)&local_a8);
            if (local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a8.data.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            _z_00 = _z_00 - 1;
          } while (_z_00 != 0);
        }
      }
      return;
    }
    __assert_fail("(float(in_size.y - extend_filter) / stride + 1) == ((in_size.y - extend_filter) / stride + 1)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/conv_layer_t.h"
                  ,0x22,"conv_layer_t::conv_layer_t(uint16_t, uint16_t, uint16_t, tdsize)");
  }
  __assert_fail("(float(in_size.x - extend_filter) / stride + 1) == ((in_size.x - extend_filter) / stride + 1)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/conv_layer_t.h"
                ,0x21,"conv_layer_t::conv_layer_t(uint16_t, uint16_t, uint16_t, tdsize)");
}

Assistant:

conv_layer_t(uint16_t stride, uint16_t extend_filter, uint16_t number_filters, tdsize in_size) :
      layer_t(layer_type::conv,
              tensor_t<float>(in_size.x, in_size.y, in_size.z),
              tensor_t<float>(in_size.x, in_size.y, in_size.z),
              tensor_t<float>(
                  (in_size.x - extend_filter) / stride + 1,
                  (in_size.y - extend_filter) / stride + 1,
                  number_filters)
      ), stride(stride), extend_filter(extend_filter) {
    assert((float(in_size.x - extend_filter) / stride + 1) == ((in_size.x - extend_filter) / stride + 1));
    assert((float(in_size.y - extend_filter) / stride + 1) == ((in_size.y - extend_filter) / stride + 1));

    for (int a = 0; a < number_filters; a++) {
      tensor_t<float> t(extend_filter, extend_filter, in_size.z);

      int maxval = extend_filter * extend_filter * in_size.z;

      for (int i = 0; i < extend_filter; i++)
        for (int j = 0; j < extend_filter; j++)
          for (int z = 0; z < in_size.z; z++)
            t(i, j, z) = 1.0f / maxval * rand() / float(RAND_MAX);
      filters.push_back(t);
    }
    for (int i = 0; i < number_filters; i++) {
      tensor_t<gradient_t> t(extend_filter, extend_filter, in_size.z);
      filter_grads.push_back(t);
    }

  }